

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_util_tests.cpp
# Opt level: O0

void __thiscall
wallet::wallet_util_tests::util_ParseISO8601DateTime::test_method(util_ParseISO8601DateTime *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  char *in_stack_fffffffffffffc18;
  lazy_ostream *in_stack_fffffffffffffc20;
  char *in_stack_fffffffffffffc28;
  const_string *in_stack_fffffffffffffc40;
  size_t in_stack_fffffffffffffc48;
  size_t line_num;
  const_string *in_stack_fffffffffffffc50;
  const_string *file;
  allocator<char> *in_stack_fffffffffffffc58;
  allocator<char> *__a;
  char *in_stack_fffffffffffffc60;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *in_stack_fffffffffffffc70;
  undefined1 local_290 [15];
  const_string local_281;
  undefined1 local_268 [32];
  allocator<char> local_248 [16];
  const_string local_238;
  undefined1 local_228 [8];
  string *local_220;
  undefined1 local_218 [16];
  undefined1 local_208 [64];
  undefined1 local_1c8 [8];
  int64_t local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [64];
  undefined1 local_168 [8];
  int64_t local_160;
  undefined1 local_158 [16];
  undefined1 local_148 [64];
  undefined1 local_108 [8];
  int64_t local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [224];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28,
               (pointer)in_stack_fffffffffffffc20,(unsigned_long)in_stack_fffffffffffffc18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
               in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc20,(char (*) [1])in_stack_fffffffffffffc18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28,
               (pointer)in_stack_fffffffffffffc20,(unsigned_long)in_stack_fffffffffffffc18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    local_100 = ParseISO8601DateTime(in_stack_fffffffffffffc70);
    local_108._0_4_ = 0;
    in_stack_fffffffffffffc28 = "0";
    in_stack_fffffffffffffc20 = (lazy_ostream *)local_108;
    in_stack_fffffffffffffc18 = "ParseISO8601DateTime(\"1970-01-01T00:00:00Z\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_e8,local_f8,0xf,1,2,&local_100);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc18);
    std::allocator<char>::~allocator((allocator<char> *)(local_108 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28,
               (pointer)in_stack_fffffffffffffc20,(unsigned_long)in_stack_fffffffffffffc18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
               in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc20,(char (*) [1])in_stack_fffffffffffffc18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28,
               (pointer)in_stack_fffffffffffffc20,(unsigned_long)in_stack_fffffffffffffc18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    local_160 = ParseISO8601DateTime(in_stack_fffffffffffffc70);
    local_168._0_4_ = 0;
    in_stack_fffffffffffffc28 = "0";
    in_stack_fffffffffffffc20 = (lazy_ostream *)local_168;
    in_stack_fffffffffffffc18 = "ParseISO8601DateTime(\"1960-01-01T00:00:00Z\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_148,local_158,0x10,1,2,&local_160);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc18);
    std::allocator<char>::~allocator((allocator<char> *)(local_168 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28,
               (pointer)in_stack_fffffffffffffc20,(unsigned_long)in_stack_fffffffffffffc18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
               in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc20,(char (*) [1])in_stack_fffffffffffffc18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28,
               (pointer)in_stack_fffffffffffffc20,(unsigned_long)in_stack_fffffffffffffc18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    local_1c0 = ParseISO8601DateTime(in_stack_fffffffffffffc70);
    local_1c8._0_4_ = 0x386d4381;
    in_stack_fffffffffffffc28 = "946684801";
    in_stack_fffffffffffffc20 = (lazy_ostream *)local_1c8;
    in_stack_fffffffffffffc18 = "ParseISO8601DateTime(\"2000-01-01T00:00:01Z\")";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_1a8,local_1b8,0x11,1,2,&local_1c0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc18);
    std::allocator<char>::~allocator((allocator<char> *)(local_1c8 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28,
               (pointer)in_stack_fffffffffffffc20,(unsigned_long)in_stack_fffffffffffffc18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
               in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc20,(char (*) [1])in_stack_fffffffffffffc18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28,
               (pointer)in_stack_fffffffffffffc20,(unsigned_long)in_stack_fffffffffffffc18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    in_stack_fffffffffffffc70 = (string *)ParseISO8601DateTime(in_stack_fffffffffffffc70);
    local_228._0_4_ = 0x4e865271;
    in_stack_fffffffffffffc28 = "1317425777";
    in_stack_fffffffffffffc20 = (lazy_ostream *)local_228;
    in_stack_fffffffffffffc18 = "ParseISO8601DateTime(\"2011-09-30T23:36:17Z\")";
    local_220 = in_stack_fffffffffffffc70;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_208,local_218,0x12,1,2,&local_220);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc18);
    std::allocator<char>::~allocator((allocator<char> *)(local_228 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    __s = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/rpc_util_tests.cpp"
    ;
    file = &local_238;
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6e;
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28,
               (pointer)in_stack_fffffffffffffc20,(unsigned_long)in_stack_fffffffffffffc18);
    __a = local_248;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)__a,file,line_num,in_stack_fffffffffffffc40);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc20,(char (*) [1])in_stack_fffffffffffffc18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc28,
               (pointer)in_stack_fffffffffffffc20,(unsigned_long)in_stack_fffffffffffffc18);
    in_stack_fffffffffffffc40 = (const_string *)(local_290 + 0xf);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
    local_281._1_8_ = ParseISO8601DateTime(in_stack_fffffffffffffc70);
    local_290._0_8_ = (_func_int **)0xf6678a7f;
    in_stack_fffffffffffffc28 = "4133980799";
    in_stack_fffffffffffffc20 = (lazy_ostream *)local_290;
    in_stack_fffffffffffffc18 = "ParseISO8601DateTime(\"2100-12-31T23:59:59Z\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_268,(undefined1 *)((long)&local_281.m_end + 1),0x13,1,2,
               (undefined1 *)((long)&local_281.m_begin + 1));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc18);
    std::allocator<char>::~allocator((allocator<char> *)(local_290 + 0xf));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(util_ParseISO8601DateTime)
{
    BOOST_CHECK_EQUAL(ParseISO8601DateTime("1970-01-01T00:00:00Z"), 0);
    BOOST_CHECK_EQUAL(ParseISO8601DateTime("1960-01-01T00:00:00Z"), 0);
    BOOST_CHECK_EQUAL(ParseISO8601DateTime("2000-01-01T00:00:01Z"), 946684801);
    BOOST_CHECK_EQUAL(ParseISO8601DateTime("2011-09-30T23:36:17Z"), 1317425777);
    BOOST_CHECK_EQUAL(ParseISO8601DateTime("2100-12-31T23:59:59Z"), 4133980799);
}